

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1c0a25::SwiftCompilerShellCommand::getVerboseDescription
          (SwiftCompilerShellCommand *this,SmallVectorImpl<char> *result)

{
  char *__s;
  pointer pSVar1;
  bool bVar2;
  void *pvVar3;
  raw_ostream *prVar4;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__n;
  void *__buf;
  void *__buf_00;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__range2;
  pointer pSVar5;
  StringRef SVar6;
  StringRef Str;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> commandLine;
  raw_svector_ostream os;
  SmallString<64U> outputFileMapPath;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_c8;
  raw_ostream local_b0;
  SmallVectorImpl<char> *local_88;
  SmallVectorImpl<char> local_80;
  undefined1 local_70 [64];
  
  __n = &local_c8;
  local_80.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_70;
  local_80.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_80.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x40;
  getOutputFileMapPath(this,&local_80);
  local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (StringRef *)0x0;
  local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (StringRef *)0x0;
  SVar6.Length._0_4_ =
       local_80.super_SmallVectorTemplateBase<char,_true>.
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  SVar6.Data = (char *)local_80.super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  SVar6.Length._4_4_ = 0;
  constructCommandLineArgs(this,SVar6,&local_c8);
  local_b0.BufferMode = InternalBuffer;
  local_b0.OutBufStart = (char *)0x0;
  local_b0.OutBufEnd = (char *)0x0;
  local_b0.OutBufCur = (char *)0x0;
  local_b0._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00251be0;
  local_88 = result;
  llvm::raw_ostream::SetUnbuffered(&local_b0);
  pSVar1 = local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar2 = true;
    pSVar5 = local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (!bVar2) {
        Str.Length = 1;
        Str.Data = " ";
        llvm::raw_ostream::operator<<(&local_b0,Str);
      }
      __s = pSVar5->Data;
      SVar6 = *pSVar5;
      if (pSVar5->Length == 0) {
LAB_00162a99:
        llvm::raw_ostream::operator<<(&local_b0,SVar6);
      }
      else {
        pvVar3 = memchr(__s,0x20,pSVar5->Length);
        __n = (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)
              CONCAT71((int7)((ulong)__n >> 8),pvVar3 == (void *)0x0);
        if ((long)pvVar3 - (long)__s == -1 || pvVar3 == (void *)0x0) goto LAB_00162a99;
        if (local_b0.OutBufCur < local_b0.OutBufEnd) {
          *local_b0.OutBufCur = '\"';
          prVar4 = &local_b0;
          local_b0.OutBufCur = local_b0.OutBufCur + 1;
        }
        else {
          prVar4 = (raw_ostream *)llvm::raw_ostream::write(&local_b0,0x22,__buf,(size_t)__n);
        }
        prVar4 = llvm::raw_ostream::operator<<(prVar4,*pSVar5);
        __n = (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)prVar4->OutBufCur;
        if (__n < prVar4->OutBufEnd) {
          prVar4->OutBufCur = (char *)((long)__n + 1);
          *(char *)__n = '\"';
        }
        else {
          llvm::raw_ostream::write(prVar4,0x22,__buf_00,(size_t)__n);
        }
      }
      pSVar5 = pSVar5 + 1;
      bVar2 = false;
    } while (pSVar5 != pSVar1);
  }
  llvm::raw_ostream::~raw_ostream(&local_b0);
  if (local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start != (StringRef *)0x0) {
    operator_delete(local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)
      local_80.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_70) {
    free(local_80.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    SmallString<64> outputFileMapPath;
    getOutputFileMapPath(outputFileMapPath);
    
    std::vector<StringRef> commandLine;
    constructCommandLineArgs(outputFileMapPath, commandLine);
    
    llvm::raw_svector_ostream os(result);
    bool first = true;
    for (const auto& arg: commandLine) {
      if (!first) os << " ";
      first = false;
      // FIXME: This isn't correct, we need utilities for doing shell quoting.
      if (arg.find(' ') != StringRef::npos) {
        os << '"' << arg << '"';
      } else {
        os << arg;
      }
    }
  }